

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<std::tuple<bool,int,int>,std::tuple<bool,int,int>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,tuple<bool,_int,_int> *expected,tuple<bool,_int,_int> *actual)

{
  _Tuple_impl<1UL,_int,_int> _Var1;
  bool bVar2;
  undefined8 in_RAX;
  tuple<bool,_int,_int> *ptVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  string local_68;
  string local_48;
  
  bVar2 = (expected->super__Tuple_impl<0UL,_bool,_int,_int>).super__Head_base<0UL,_bool,_false>.
          _M_head_impl;
  if ((bVar2 == (bool)actual_str[8]) &&
     (_Var1 = (expected->super__Tuple_impl<0UL,_bool,_int,_int>).super__Tuple_impl<1UL,_int,_int>,
     iVar5 = -(uint)((_Head_base<2UL,_int,_false>)(int)*(undefined8 *)actual_str ==
                    _Var1.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl
                    .super__Head_base<2UL,_int,_false>),
     iVar6 = -(uint)((int)((ulong)*(undefined8 *)actual_str >> 0x20) ==
                    _Var1.super__Head_base<1UL,_int,_false>._M_head_impl._M_head_impl),
     auVar4._4_4_ = iVar5, auVar4._0_4_ = iVar5, auVar4._8_4_ = iVar6, auVar4._12_4_ = iVar6,
     iVar5 = movmskpd((int)CONCAT71((int7)((ulong)in_RAX >> 8),bVar2),auVar4), iVar5 == 3)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    ptVar3 = (tuple<bool,_int,_int> *)actual_str;
    FormatForComparisonFailureMessage<std::tuple<bool,int,int>,std::tuple<bool,int,int>>
              (&local_48,(internal *)actual_str,expected,(tuple<bool,_int,_int> *)actual_str);
    FormatForComparisonFailureMessage<std::tuple<bool,int,int>,std::tuple<bool,int,int>>
              (&local_68,(internal *)expected,(tuple<bool,_int,_int> *)actual_str,ptVar3);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }